

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assignment.h
# Opt level: O2

ptr<Value> __thiscall Assignment::evaluate(Assignment *this,Environment *env)

{
  Scope scope;
  long *plVar1;
  bool bVar2;
  ThrowPacket *this_00;
  Identifier *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  string *ident;
  ptr<Value> pVar3;
  ptr<Value> newValue;
  ptr<Symbol> symbol;
  ptr<Value> currValue;
  __shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2> local_48;
  ptr<Value> local_38;
  
  std::dynamic_pointer_cast<Symbol,Expression>((shared_ptr<Expression> *)&symbol);
  if (symbol.super___shared_ptr<Symbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    bVar2 = Environment::hasSymbol
                      ((Environment *)in_RDX,
                       &(symbol.super___shared_ptr<Symbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->name
                      );
    if (bVar2) {
      Environment::getValue((Environment *)&currValue,in_RDX);
      (*(code *)**(undefined8 **)(env->symbols)._M_h._M_element_count)(&newValue);
      plVar1 = (long *)(env->symbols)._M_h._M_rehash_policy._M_next_resize;
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 0x30))(&local_48,plVar1,&currValue,&newValue);
        std::__shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&newValue.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>,&local_48);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
      }
      scope = (symbol.super___shared_ptr<Symbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->scope;
      ident = &(symbol.super___shared_ptr<Symbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->name;
      std::__shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_58,&newValue.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>);
      Environment::putValue
                ((Environment *)in_RDX,ident,scope,(ptr<Value> *)&local_58,
                 (symbol.super___shared_ptr<Symbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->constant);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
      (this->super_BinaryOperator).super_Expression._vptr_Expression = (_func_int **)0x0;
      (this->super_BinaryOperator).leftExpression.
      super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&newValue.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&currValue.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&symbol.super___shared_ptr<Symbol,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      pVar3.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           extraout_RDX._M_pi;
      pVar3.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
      return (ptr<Value>)pVar3.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>;
    }
  }
  this_00 = (ThrowPacket *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&currValue,"The member is not defined",(allocator<char> *)&newValue);
  ExceptionObjects::undefined((string *)&local_38);
  ThrowPacket::ThrowPacket(this_00,&local_38);
  __cxa_throw(this_00,&ThrowPacket::typeinfo,CarrierPacket::~CarrierPacket);
}

Assistant:

ptr<Value> evaluate(Environment *env) override {
        ptr<Symbol> symbol = std::dynamic_pointer_cast<Symbol>(leftExpression);

        if(!symbol || !(env -> hasSymbol(symbol -> name)))
            throw ThrowPacket(ExceptionObjects::undefined("The member is not defined"));

        ptr<Value> currValue = env -> getValue(symbol -> name);
        ptr<Value> newValue = rightExpression -> evaluate(env);

        if(operation)
            newValue = operation -> getResult(currValue, newValue);

        env -> putValue(symbol -> name, symbol -> scope, newValue, symbol -> constant);
        return nullptr;
    }